

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

UINT32 GetNthAudioDriver(UINT8 adrvType,INT32 drvNumber)

{
  AUDDRV_INFO *local_30;
  AUDDRV_INFO *drvInfo;
  UINT32 local_20;
  UINT32 lastDrv;
  INT32 typedDrv;
  UINT32 curDrv;
  UINT32 drvCount;
  INT32 drvNumber_local;
  UINT8 adrvType_local;
  
  if (drvNumber == -1) {
    drvNumber_local = -1;
  }
  else {
    curDrv = drvNumber;
    drvCount._3_1_ = adrvType;
    typedDrv = Audio_GetDriverCount();
    drvInfo._4_4_ = 0xffffffff;
    local_20 = 0;
    for (lastDrv = 0; lastDrv < (uint)typedDrv; lastDrv = lastDrv + 1) {
      Audio_GetDriverInfo(lastDrv,&local_30);
      if (local_30->drvType == drvCount._3_1_) {
        drvInfo._4_4_ = lastDrv;
        if (local_20 == curDrv) {
          return lastDrv;
        }
        local_20 = local_20 + 1;
      }
    }
    if (curDrv == 0xfffffffe) {
      drvNumber_local = drvInfo._4_4_;
    }
    else {
      drvNumber_local = -1;
    }
  }
  return drvNumber_local;
}

Assistant:

static UINT32 GetNthAudioDriver(UINT8 adrvType, INT32 drvNumber)
{
	// special numbers for drvNumber:
	//	-1 - don't select any
	//	-2 - select last found driver
	if (drvNumber == -1)
		return (UINT32)-1;
	
	UINT32 drvCount;
	UINT32 curDrv;
	INT32 typedDrv;
	UINT32 lastDrv;
	AUDDRV_INFO* drvInfo;
	
	// go through all audio drivers get the ID of the requested Output/Disk Writer driver
	drvCount = Audio_GetDriverCount();
	lastDrv = (UINT32)-1;
	for (typedDrv = 0, curDrv = 0; curDrv < drvCount; curDrv ++)
	{
		Audio_GetDriverInfo(curDrv, &drvInfo);
		if (drvInfo->drvType == adrvType)
		{
			lastDrv = curDrv;
			if (typedDrv == drvNumber)
				return curDrv;
			typedDrv ++;
		}
	}
	
	if (drvNumber == -2)
		return lastDrv;
	return (UINT32)-1;
}